

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
BasicBuildSystemFrontendDelegate::cycleDetected
          (BasicBuildSystemFrontendDelegate *this,
          vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *items)

{
  vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *in_RDX;
  string message;
  Twine local_50;
  string local_38;
  
  llbuild::buildsystem::BuildSystemInvocation::formatDetectedCycle_abi_cxx11_
            (&local_38,(BuildSystemInvocation *)items,in_RDX);
  llvm::Twine::Twine(&local_50,&local_38);
  llbuild::buildsystem::BuildSystemFrontendDelegate::error
            (&this->super_BuildSystemFrontendDelegate,&local_50);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

virtual void cycleDetected(const std::vector<core::Rule*>& items) override {
    auto message = BuildSystemInvocation::formatDetectedCycle(items);
    error(message);
  }